

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Automatic.cpp
# Opt level: O0

void __thiscall Automatic::fillAll(Automatic *this,int from,int to)

{
  mapped_type mVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  key_type local_1e;
  key_type local_1d;
  int local_1c;
  mapped_type local_18;
  int j;
  int to_local;
  int from_local;
  Automatic *this_local;
  
  local_18 = to;
  j = from;
  _to_local = this;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    local_1d = (key_type)local_1c;
    sVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
            count(this->ac + j,&local_1d);
    mVar1 = local_18;
    if (sVar2 == 0) {
      local_1e = (key_type)local_1c;
      pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[](this->ac + j,&local_1e);
      *pmVar3 = mVar1;
    }
  }
  return;
}

Assistant:

void Automatic::fillAll(int from, int to) {
    for(int j = 0; j < 256; ++j) {
        //避免出现覆盖问题
        if (ac[from].count(char(j)) != 0) continue;
        ac[from][char(j)] = to;
    }
}